

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.h
# Opt level: O0

void __thiscall
lemon::
BellmanFord<lemon::SmartDigraph,_bidirectional::ResourceMap,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_bidirectional::ResourceMap>_>
::create_maps(BellmanFord<lemon::SmartDigraph,_bidirectional::ResourceMap,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_bidirectional::ResourceMap>_>
              *this)

{
  _List_node_base *p_Var1;
  DistMap *pDVar2;
  Digraph *digraph;
  NodeMap<bool> *in_RDI;
  SmartDigraph *in_stack_fffffffffffffff0;
  
  if ((in_RDI->
      super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
      ).
      super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
      .super_Map.super_ObserverBase._index._M_node == (_List_node_base *)0x0) {
    *(undefined1 *)
     &(in_RDI->
      super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
      ).
      super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
      .super_Map.container.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = 1;
    p_Var1 = (_List_node_base *)
             BellmanFordDefaultTraits<lemon::SmartDigraph,_bidirectional::ResourceMap>::
             createPredMap(in_stack_fffffffffffffff0);
    (in_RDI->
    super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
    ).
    super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
    .super_Map.super_ObserverBase._index._M_node = p_Var1;
  }
  if (*(long *)((long)&(in_RDI->
                       super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
                       ).
                       super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
                       .super_Map.container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data + 8) == 0) {
    *(undefined1 *)
     &(((_Bit_iterator *)
       ((long)&(in_RDI->
               super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
               ).
               super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
               .super_Map.container.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p = 1;
    pDVar2 = BellmanFordDefaultTraits<lemon::SmartDigraph,_bidirectional::ResourceMap>::
             createDistMap(in_stack_fffffffffffffff0);
    *(DistMap **)
     ((long)&(in_RDI->
             super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
             ).
             super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
             .super_Map.container.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data + 8) = pDVar2;
  }
  if (*(long *)((long)&(in_RDI->
                       super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
                       ).
                       super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
                       .super_Map.container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data + 0x18) == 0) {
    digraph = (Digraph *)operator_new(0x40);
    DigraphExtender<lemon::SmartDigraphBase>::NodeMap<bool>::NodeMap(in_RDI,digraph);
    *(Digraph **)
     ((long)&(in_RDI->
             super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
             ).
             super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
             .super_Map.container.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data + 0x18) = digraph;
  }
  return;
}

Assistant:

void create_maps() {
    if (!_pred) {
      _local_pred = true;
      _pred       = Traits::createPredMap(*_gr);
    }
    if (!_dist) {
      _local_dist = true;
      _dist       = Traits::createDistMap(*_gr);
    }
    if (!_mask) {
      _mask = new MaskMap(*_gr);
    }
  }